

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::clear
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this)

{
  CJoystick *pCVar1;
  CJoystick *in_RDI;
  int in_stack_00000024;
  
  allocator_default<CInput::CJoystick>::free_array(in_RDI);
  *(undefined4 *)&in_RDI->m_pInput = 1;
  pCVar1 = allocator_default<CInput::CJoystick>::alloc_array(in_stack_00000024);
  (in_RDI->super_IJoystick)._vptr_IJoystick = (_func_int **)pCVar1;
  *(undefined4 *)((long)&in_RDI->m_pInput + 4) = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}